

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int *piVar3;
  void *pvVar4;
  Layer *pLVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 auVar23 [32];
  undefined1 uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  undefined4 *puVar30;
  ulong uVar31;
  long lVar32;
  _func_int *p_Var33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  float fVar39;
  int iVar40;
  Option *_elemsize;
  Option *opt_00;
  _func_int **pp_Var41;
  int iVar42;
  long lVar43;
  int iVar44;
  undefined1 (*pauVar45) [16];
  undefined1 (*pauVar46) [16];
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar66;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar63 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  float fVar93;
  undefined1 auVar74 [16];
  float fVar94;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  v4sf one;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  Option opt_q;
  float top_rescale;
  Mat bottom_blob_bordered;
  float scale_out;
  Option opt_g;
  int local_33c;
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  size_t local_2d8;
  float *local_2c8;
  float *local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  Mat *local_2a8;
  _func_int **local_2a0;
  _func_int **local_298;
  long local_290;
  undefined1 local_288 [40];
  undefined1 auStack_260 [16];
  ulong uStack_250;
  size_t local_248;
  long local_238;
  ulong local_230;
  Mat local_228;
  undefined8 local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  Allocator *local_1c8;
  int local_1c0;
  Allocator *local_1b8;
  undefined1 local_1b0 [16];
  int local_1a0;
  ulong local_198;
  void *local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  Allocator *local_178;
  int local_170;
  Allocator *local_168;
  undefined1 local_160 [16];
  int local_150;
  ulong local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [56];
  int local_f0;
  size_t local_e8;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  undefined4 uVar17;
  undefined3 uVar19;
  undefined2 uVar21;
  
  local_128._24_4_ = bottom_blob->elempack;
  local_f0 = bottom_blob->c;
  if (local_128._24_4_ == 0) {
    bVar48 = false;
  }
  else {
    bVar48 = ((int)bottom_blob->elemsize << 3) / (int)local_128._24_4_ == 8;
  }
  p_Var33 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var33);
  iVar42 = *(int *)(&this->field_0xd8 + (long)p_Var33);
  iVar37 = *(int *)(&this->field_0xdc + (long)p_Var33);
  iVar44 = *(int *)(&this->field_0xe0 + (long)p_Var33);
  piVar3 = bottom_blob->refcount;
  local_128._0_8_ = bottom_blob->data;
  local_128._8_4_ = SUB84(bottom_blob->refcount,0);
  local_128._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_128._16_8_ = bottom_blob->elemsize;
  local_128._32_8_ = bottom_blob->allocator;
  local_128._40_4_ = bottom_blob->dims;
  local_128._44_4_ = bottom_blob->w;
  local_128._48_4_ = bottom_blob->h;
  local_128._52_4_ = bottom_blob->d;
  local_e8 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (!bVar48) {
    uVar34 = (long)(local_128._24_4_ * local_f0) /
             (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])
    ;
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    local_2a8 = top_blob;
    Mat::create(&local_228,local_128._24_4_ * local_f0,4,(Allocator *)0x0);
    top_blob = local_2a8;
    pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx;
    p_Var33 = pp_Var41[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var33)) {
      lVar32 = 0;
      puVar30 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar34) {
          uVar2 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var33) + lVar32 * 4);
          uVar47 = uVar34 & 0xffffffff;
          do {
            *puVar30 = uVar2;
            puVar30 = puVar30 + 1;
            uVar36 = (int)uVar47 - 1;
            uVar47 = (ulong)uVar36;
          } while (uVar36 != 0);
        }
        lVar32 = lVar32 + 1;
        p_Var33 = pp_Var41[-3];
      } while (lVar32 < *(int *)(&this->field_0x108 + (long)p_Var33));
    }
    local_318._0_8_ = *(undefined8 *)opt;
    local_318._16_8_ = opt->workspace_allocator;
    uVar6 = opt->openmp_blocktime;
    uVar7 = opt->use_winograd_convolution;
    uVar9 = opt->use_sgemm_convolution;
    uVar11 = opt->use_int8_inference;
    uVar13 = opt->use_vulkan_compute;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    local_2f8[0] = opt->use_bf16_storage;
    local_2f8[1] = opt->use_fp16_packed;
    local_2f8[2] = opt->use_fp16_storage;
    local_2f8[3] = opt->use_fp16_arithmetic;
    local_2f8[4] = opt->use_int8_packed;
    local_2f8[5] = opt->use_int8_storage;
    local_2f8[6] = opt->use_int8_arithmetic;
    local_2f8[7] = opt->use_packing_layout;
    local_2f8[8] = opt->use_shader_pack8;
    local_2f8[9] = opt->use_subgroup_basic;
    local_2f8[10] = opt->use_subgroup_vote;
    local_2f8[0xb] = opt->use_subgroup_ballot;
    local_2f8[0xc] = opt->use_subgroup_shuffle;
    local_2f8[0xd] = opt->use_image_storage;
    local_2f8[0xe] = opt->use_tensor_storage;
    local_2f8[0xf] = opt->use_weight_fp16_storage;
    local_2f8._16_4_ = opt->flush_denormals;
    local_2f8[0x14] = opt->use_local_pool_allocator;
    local_2f8[0x15] = opt->use_reserved_1;
    local_2f8[0x16] = opt->use_reserved_2;
    local_2f8[0x17] = opt->use_reserved_3;
    local_2f8[0x18] = opt->use_reserved_4;
    local_2f8[0x19] = opt->use_reserved_5;
    local_2f8[0x1a] = opt->use_reserved_6;
    local_2f8[0x1b] = opt->use_reserved_7;
    local_2f8[0x1c] = opt->use_reserved_8;
    local_2f8[0x1d] = opt->use_reserved_9;
    local_2f8[0x1e] = opt->use_reserved_10;
    local_2f8[0x1f] = opt->use_reserved_11;
    local_318._8_4_ = SUB84(opt->workspace_allocator,0);
    local_318._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_318._24_4_ = uVar6;
    local_318._28_4_ = uVar8;
    quantize_to_int8(bottom_blob,(Mat *)local_128,&local_228,(Option *)local_318);
    piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_228.cstep = 0;
  local_228.data = (pointer)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]),(Mat *)local_128,&local_228,opt);
  iVar29 = -100;
  local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
  if (((pointer)local_228.data == (pointer)0x0) ||
     (local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_),
     (long)local_228.c * local_228.cstep == 0)) goto LAB_0028c38a;
  p_Var33 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar27 = (~((iVar27 + -1) * iVar37) + local_228.w) / *(int *)(&this->field_0xe4 + (long)p_Var33);
  iVar37 = iVar27 + 1;
  uVar34 = (long)(~((iVar42 + -1) * iVar44) + local_228.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var33);
  local_230 = uVar34 & 0xffffffff;
  iVar42 = (int)uVar34 + 1;
  local_138._0_4_ = local_228.elempack;
  uVar36 = local_228.c * local_228.elempack;
  if ((uVar36 == *(uint *)(&this->field_0x108 + (long)p_Var33)) &&
     (uVar26 = *(uint *)(&this->field_0xd0 + (long)p_Var33),
     *(uint *)(&this->field_0x108 + (long)p_Var33) == uVar26)) {
    local_238 = CONCAT44(local_238._4_4_,local_228.w);
    uVar36 = 8;
    if (opt->use_packing_layout == false) {
      uVar36 = 1;
    }
    if ((uVar26 & 7) != 0) {
      uVar36 = 1;
    }
    opt_00 = (Option *)(ulong)uVar36;
    iVar44 = *(int *)(&this->field_0x10c + (long)p_Var33);
    _elemsize = (Option *)(ulong)(uVar36 * 4);
    if (100 < iVar44) {
      _elemsize = opt_00;
    }
    local_2a0 = (_func_int **)(ulong)(uint)local_228.c;
    Mat::create(top_blob,iVar37,iVar42,(int)uVar26 / (int)uVar36,(size_t)_elemsize,uVar36,
                opt->blob_allocator);
    iVar29 = -100;
    local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
    if ((top_blob->data == (void *)0x0) ||
       (local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_),
       (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0028c38a;
    iVar29 = 0;
    if (local_138._0_4_ != 1) {
      local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (local_138._0_4_ != 8) goto LAB_0028c38a;
      uVar34 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             );
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_318,uVar34,(allocator_type *)local_288);
      pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var33 = pp_Var41[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var33)) {
        iVar42 = *(int *)(&this->field_0xe0 + (long)p_Var33);
        iVar37 = *(int *)(&this->field_0xdc + (long)p_Var33);
        iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var33);
        iVar38 = 0;
        fVar39 = 0.0;
        iVar40 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var41[-3])) {
            lVar32 = 0;
            do {
              *(float *)(local_318._0_8_ + (iVar38 + lVar32) * 4) = fVar39;
              fVar39 = (float)((int)fVar39 + *(int *)(&this->field_0xdc + (long)pp_Var41[-3]));
              lVar32 = lVar32 + 1;
            } while ((int)lVar32 < *(int *)(&this->field_0xd4 + (long)pp_Var41[-3]));
            iVar38 = iVar38 + (int)lVar32;
          }
          fVar39 = (float)((int)fVar39 + (iVar42 * (int)local_238 - iVar37 * iVar29));
          iVar40 = iVar40 + 1;
          opt_00 = (Option *)pp_Var41[-3];
        } while (iVar40 < *(int *)(&this->field_0xd8 + (long)opt_00));
      }
      if (0 < (int)local_2a0) {
        iVar42 = (int)uVar34 * 8;
        local_290 = CONCAT44(local_290._4_4_,iVar42);
        local_2b8 = 0;
        auVar137 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        auVar55 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar134 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        local_298 = (_func_int **)0x0;
        do {
          if (-1 < (int)local_230) {
            local_2c8 = (float *)(local_228.cstep * (long)local_298 * local_228.elemsize +
                                 (long)local_228.data);
            pauVar45 = (undefined1 (*) [16])
                       (top_blob->cstep * (long)local_298 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx;
            opt_00 = (Option *)((long)local_298 * 8);
            pvVar4 = (this->weight_data_int8).data;
            uVar47 = 0;
            pauVar46 = pauVar45;
            do {
              local_2b0 = uVar47;
              iVar37 = (int)local_2b0;
              if (-1 < iVar27) {
                local_2c0 = (float *)(long)iVar37;
                iVar29 = 0;
                do {
                  p_Var33 = pp_Var41[-3];
                  if ((int)uVar34 < 1) {
                    auVar100 = ZEXT816(0) << 0x40;
                    auVar99 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar63 = ZEXT1664((undefined1  [16])0x0);
                    uVar47 = 0;
                    auVar73 = ZEXT1664((undefined1  [16])0x0);
                    do {
                      auVar100._8_8_ = 0;
                      auVar100._0_8_ =
                           *(ulong *)((long)local_2c8 +
                                     (long)(int)*(pointer)(local_318._0_8_ + uVar47 * 4) * 8 +
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var33) *
                                     (long)local_2c0 * (long)local_228.w * local_228.elemsize +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var33) * iVar29 * 8
                                           ));
                      auVar99 = vpcmpgtb_avx((undefined1  [16])0x0,auVar100);
                      auVar100 = vpunpcklbw_avx(auVar100,auVar99);
                      auVar95._8_8_ = 0;
                      auVar95._0_8_ = *(ulong *)((long)pvVar4 + uVar47 * 8 + (long)(int)local_2b8);
                      auVar99 = vpcmpgtb_avx((undefined1  [16])0x0,auVar95);
                      auVar99 = vpunpcklbw_avx(auVar95,auVar99);
                      auVar95 = vpmullw_avx(auVar99,auVar100);
                      auVar100 = vpmulhw_avx(auVar100,auVar99);
                      auVar99 = vpunpcklwd_avx(auVar95,auVar100);
                      auVar99 = vpaddd_avx(auVar63._0_16_,auVar99);
                      auVar63 = ZEXT1664(auVar99);
                      auVar100 = vpunpckhwd_avx(auVar95,auVar100);
                      auVar100 = vpaddd_avx(auVar73._0_16_,auVar100);
                      auVar73 = ZEXT1664(auVar100);
                      uVar47 = uVar47 + 1;
                    } while ((uVar34 & 0xffffffff) != uVar47);
                    auVar99 = vcvtdq2ps_avx(auVar99);
                    auVar100 = vcvtdq2ps_avx(auVar100);
                  }
                  auVar95 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1f8 + (long)p_Var33) + (long)local_298 * 0x20
                             );
                  auVar67 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1f8 + (long)p_Var33) + 0x10 +
                             (long)local_298 * 0x20);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var33) +
                                    (long)local_298 * 0x20);
                  auVar96._0_4_ = auVar95._0_4_ * *pfVar1;
                  auVar96._4_4_ = auVar95._4_4_ * pfVar1[1];
                  auVar96._8_4_ = auVar95._8_4_ * pfVar1[2];
                  auVar96._12_4_ = auVar95._12_4_ * pfVar1[3];
                  auVar57 = vrcpps_avx(auVar96);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var33) + 0x10 +
                                    (long)local_298 * 0x20);
                  auVar111._0_4_ = auVar67._0_4_ * *pfVar1;
                  auVar111._4_4_ = auVar67._4_4_ * pfVar1[1];
                  auVar111._8_4_ = auVar67._8_4_ * pfVar1[2];
                  auVar111._12_4_ = auVar67._12_4_ * pfVar1[3];
                  auVar96 = vrcpps_avx(auVar111);
                  auVar95 = vcmpps_avx(auVar95,(undefined1  [16])0x0,4);
                  auVar95 = vandps_avx(auVar95,auVar57);
                  auVar57._0_4_ = auVar95._0_4_ * auVar99._0_4_;
                  auVar57._4_4_ = auVar95._4_4_ * auVar99._4_4_;
                  auVar57._8_4_ = auVar95._8_4_ * auVar99._8_4_;
                  auVar57._12_4_ = auVar95._12_4_ * auVar99._12_4_;
                  auVar99 = vcmpps_avx(auVar67,(undefined1  [16])0x0,4);
                  auVar99 = vandps_avx(auVar99,auVar96);
                  auVar67._0_4_ = auVar99._0_4_ * auVar100._0_4_;
                  auVar67._4_4_ = auVar99._4_4_ * auVar100._4_4_;
                  auVar67._8_4_ = auVar99._8_4_ * auVar100._8_4_;
                  auVar67._12_4_ = auVar99._12_4_ * auVar100._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var33) != 0) {
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var33) +
                                      (long)local_298 * 0x20);
                    auVar57._0_4_ = auVar57._0_4_ + *pfVar1;
                    auVar57._4_4_ = auVar57._4_4_ + pfVar1[1];
                    auVar57._8_4_ = auVar57._8_4_ + pfVar1[2];
                    auVar57._12_4_ = auVar57._12_4_ + pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var33) + 0x10 +
                                      (long)local_298 * 0x20);
                    auVar67._0_4_ = auVar67._0_4_ + *pfVar1;
                    auVar67._4_4_ = auVar67._4_4_ + pfVar1[1];
                    auVar67._8_4_ = auVar67._8_4_ + pfVar1[2];
                    auVar67._12_4_ = auVar67._12_4_ + pfVar1[3];
                  }
                  iVar38 = *(int *)(&this->field_0x110 + (long)p_Var33) + -1;
                  fVar39 = auVar55._0_4_;
                  fVar50 = auVar55._4_4_;
                  fVar93 = auVar55._8_4_;
                  fVar94 = auVar55._12_4_;
                  fVar56 = auVar57._0_4_;
                  fVar64 = auVar57._4_4_;
                  fVar65 = auVar57._8_4_;
                  fVar66 = auVar57._12_4_;
                  switch(iVar38) {
                  case 0:
                    auVar57 = vmaxps_avx(auVar57,(undefined1  [16])0x0);
                    break;
                  case 1:
                    auVar99 = vmaxps_avx(auVar57,(undefined1  [16])0x0);
                    auVar100 = vminps_avx(auVar57,(undefined1  [16])0x0);
                    fVar39 = **(float **)(&this->field_0x118 + (long)p_Var33);
                    auVar57._0_4_ = fVar39 * auVar100._0_4_ + auVar99._0_4_;
                    auVar57._4_4_ = fVar39 * auVar100._4_4_ + auVar99._4_4_;
                    auVar57._8_4_ = fVar39 * auVar100._8_4_ + auVar99._8_4_;
                    auVar57._12_4_ = fVar39 * auVar100._12_4_ + auVar99._12_4_;
                    break;
                  case 2:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var33);
                    auVar78._4_4_ = uVar2;
                    auVar78._0_4_ = uVar2;
                    auVar78._8_4_ = uVar2;
                    auVar78._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var33))[1];
                    auVar103._4_4_ = uVar2;
                    auVar103._0_4_ = uVar2;
                    auVar103._8_4_ = uVar2;
                    auVar103._12_4_ = uVar2;
                    auVar99 = vmaxps_avx(auVar57,auVar78);
                    auVar57 = vminps_avx(auVar99,auVar103);
                    break;
                  case 3:
                    auVar58._0_4_ = auVar137._0_4_ ^ (uint)fVar56;
                    auVar58._4_4_ = auVar137._4_4_ ^ (uint)fVar64;
                    auVar58._8_4_ = auVar137._8_4_ ^ (uint)fVar65;
                    auVar58._12_4_ = auVar137._12_4_ ^ (uint)fVar66;
                    auVar99 = vminps_avx(auVar134._0_16_,auVar58);
                    auVar79._8_4_ = 0xc2b0c0a5;
                    auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar79._12_4_ = 0xc2b0c0a5;
                    auVar95 = vmaxps_avx(auVar99,auVar79);
                    auVar80._0_4_ = auVar95._0_4_ * 1.442695 + fVar39;
                    auVar80._4_4_ = auVar95._4_4_ * 1.442695 + fVar50;
                    auVar80._8_4_ = auVar95._8_4_ * 1.442695 + fVar93;
                    auVar80._12_4_ = auVar95._12_4_ * 1.442695 + fVar94;
                    auVar104._0_4_ = (int)auVar80._0_4_;
                    auVar104._4_4_ = (int)auVar80._4_4_;
                    auVar104._8_4_ = (int)auVar80._8_4_;
                    auVar104._12_4_ = (int)auVar80._12_4_;
                    auVar100 = vcvtdq2ps_avx(auVar104);
                    auVar99 = vcmpps_avx(auVar80,auVar100,1);
                    auVar99 = vandps_avx(auVar49,auVar99);
                    auVar99 = vsubps_avx(auVar100,auVar99);
                    fVar56 = auVar95._0_4_ + auVar99._0_4_ * -0.6931472;
                    fVar64 = auVar95._4_4_ + auVar99._4_4_ * -0.6931472;
                    fVar65 = auVar95._8_4_ + auVar99._8_4_ * -0.6931472;
                    fVar66 = auVar95._12_4_ + auVar99._12_4_ * -0.6931472;
                    auVar81._0_4_ = (int)auVar99._0_4_;
                    auVar81._4_4_ = (int)auVar99._4_4_;
                    auVar81._8_4_ = (int)auVar99._8_4_;
                    auVar81._12_4_ = (int)auVar99._12_4_;
                    auVar99 = vpslld_avx(auVar81,0x17);
                    auVar99 = vpaddd_avx(auVar49,auVar99);
                    auVar59._0_4_ =
                         (fVar56 + 1.0 +
                         fVar56 * fVar56 *
                         (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) *
                            fVar56 + 0.041665796) * fVar56 + 0.16666666) * fVar56 + fVar39)) *
                         auVar99._0_4_ + 1.0;
                    auVar59._4_4_ =
                         (fVar64 + 1.0 +
                         fVar64 * fVar64 *
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + fVar50)) *
                         auVar99._4_4_ + 1.0;
                    auVar59._8_4_ =
                         (fVar65 + 1.0 +
                         fVar65 * fVar65 *
                         (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) *
                            fVar65 + 0.041665796) * fVar65 + 0.16666666) * fVar65 + fVar93)) *
                         auVar99._8_4_ + 1.0;
                    auVar59._12_4_ =
                         (fVar66 + 1.0 +
                         fVar66 * fVar66 *
                         (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) *
                            fVar66 + 0.041665796) * fVar66 + 0.16666666) * fVar66 + fVar94)) *
                         auVar99._12_4_ + 1.0;
                    auVar99 = vrcpps_avx(auVar59);
                    fVar39 = auVar99._0_4_;
                    auVar60._0_4_ = auVar59._0_4_ * fVar39;
                    fVar50 = auVar99._4_4_;
                    auVar60._4_4_ = auVar59._4_4_ * fVar50;
                    fVar93 = auVar99._8_4_;
                    auVar60._8_4_ = auVar59._8_4_ * fVar93;
                    fVar94 = auVar99._12_4_;
                    auVar60._12_4_ = auVar59._12_4_ * fVar94;
                    auVar99 = vsubps_avx(auVar49,auVar60);
                    auVar57._0_4_ = fVar39 + fVar39 * auVar99._0_4_;
                    auVar57._4_4_ = fVar50 + fVar50 * auVar99._4_4_;
                    auVar57._8_4_ = fVar93 + fVar93 * auVar99._8_4_;
                    auVar57._12_4_ = fVar94 + fVar94 * auVar99._12_4_;
                    break;
                  case 4:
                    auVar99 = vminps_avx(auVar134._0_16_,auVar57);
                    auVar135._8_4_ = 0xc2b0c0a5;
                    auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar135._12_4_ = 0xc2b0c0a5;
                    auVar95 = vmaxps_avx(auVar135,auVar99);
                    auVar97._0_4_ = auVar95._0_4_ * 1.442695 + fVar39;
                    auVar97._4_4_ = auVar95._4_4_ * 1.442695 + fVar50;
                    auVar97._8_4_ = auVar95._8_4_ * 1.442695 + fVar93;
                    auVar97._12_4_ = auVar95._12_4_ * 1.442695 + fVar94;
                    auVar112._0_4_ = (int)auVar97._0_4_;
                    auVar112._4_4_ = (int)auVar97._4_4_;
                    auVar112._8_4_ = (int)auVar97._8_4_;
                    auVar112._12_4_ = (int)auVar97._12_4_;
                    auVar100 = vcvtdq2ps_avx(auVar112);
                    auVar99 = vcmpps_avx(auVar97,auVar100,1);
                    auVar99 = vandps_avx(auVar49,auVar99);
                    auVar99 = vsubps_avx(auVar100,auVar99);
                    auVar113._0_4_ = auVar99._0_4_ * 0.6931472;
                    auVar113._4_4_ = auVar99._4_4_ * 0.6931472;
                    auVar113._8_4_ = auVar99._8_4_ * 0.6931472;
                    auVar113._12_4_ = auVar99._12_4_ * 0.6931472;
                    auVar100 = vsubps_avx(auVar95,auVar113);
                    fVar39 = auVar100._0_4_;
                    fVar50 = auVar100._4_4_;
                    fVar93 = auVar100._8_4_;
                    fVar94 = auVar100._12_4_;
                    auVar98._0_4_ = (int)auVar99._0_4_;
                    auVar98._4_4_ = (int)auVar99._4_4_;
                    auVar98._8_4_ = (int)auVar99._8_4_;
                    auVar98._12_4_ = (int)auVar99._12_4_;
                    auVar99 = vpslld_avx(auVar98,0x17);
                    auVar99 = vpaddd_avx(auVar49,auVar99);
                    auVar128._0_4_ =
                         (fVar39 + 1.0 +
                         (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                            fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                         fVar39 * fVar39) * auVar99._0_4_ + 1.0;
                    auVar128._4_4_ =
                         (fVar50 + 1.0 +
                         (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) *
                            fVar50 + 0.041665796) * fVar50 + 0.16666666) * fVar50 + 0.5) *
                         fVar50 * fVar50) * auVar99._4_4_ + 1.0;
                    auVar128._8_4_ =
                         (fVar93 + 1.0 +
                         (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) *
                            fVar93 + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) *
                         fVar93 * fVar93) * auVar99._8_4_ + 1.0;
                    auVar128._12_4_ =
                         (fVar94 + 1.0 +
                         (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                            fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                         fVar94 * fVar94) * auVar99._12_4_ + 1.0;
                    auVar74._8_4_ = 0x800000;
                    auVar74._0_8_ = 0x80000000800000;
                    auVar74._12_4_ = 0x800000;
                    auVar99 = vmaxps_avx(auVar128,auVar74);
                    auVar100 = vpsrld_avx(auVar99,0x17);
                    auVar114._8_4_ = 0x807fffff;
                    auVar114._0_8_ = 0x807fffff807fffff;
                    auVar114._12_4_ = 0x807fffff;
                    auVar99 = vandps_avx(auVar99,auVar114);
                    auVar115._8_4_ = 0x3f000000;
                    auVar115._0_8_ = 0x3f0000003f000000;
                    auVar115._12_4_ = 0x3f000000;
                    auVar57 = vorps_avx(auVar99,auVar115);
                    auVar116._8_4_ = 0xffffff82;
                    auVar116._0_8_ = 0xffffff82ffffff82;
                    auVar116._12_4_ = 0xffffff82;
                    auVar99 = vpaddd_avx(auVar100,auVar116);
                    auVar95 = vcvtdq2ps_avx(auVar99);
                    auVar117._8_4_ = 0x3f3504f3;
                    auVar117._0_8_ = 0x3f3504f33f3504f3;
                    auVar117._12_4_ = 0x3f3504f3;
                    auVar100 = vcmpps_avx(auVar57,auVar117,1);
                    auVar99 = vandps_avx(auVar100,auVar57);
                    fVar39 = auVar99._0_4_ + auVar57._0_4_ + -1.0;
                    fVar50 = auVar99._4_4_ + auVar57._4_4_ + -1.0;
                    fVar93 = auVar99._8_4_ + auVar57._8_4_ + -1.0;
                    fVar94 = auVar99._12_4_ + auVar57._12_4_ + -1.0;
                    auVar99 = vandps_avx(auVar49,auVar100);
                    auVar100 = vsubps_avx(auVar95,auVar99);
                    auVar132._8_4_ = 0x42b0c0a5;
                    auVar132._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar132._12_4_ = 0x42b0c0a5;
                    auVar134 = ZEXT1664(auVar132);
                    auVar99 = vcmpps_avx(auVar128,(undefined1  [16])0x0,2);
                    auVar75._0_4_ =
                         (auVar100._0_4_ * 0.6931472 + fVar39 +
                         (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) *
                                fVar39 + -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057)
                             * fVar39 + 0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) *
                          fVar39 + -0.5) * fVar39 * fVar39) * -2.0;
                    auVar75._4_4_ =
                         (auVar100._4_4_ * 0.6931472 + fVar50 +
                         (((((((((fVar50 * 0.070376836 + -0.1151461) * fVar50 + 0.116769984) *
                                fVar50 + -0.12420141) * fVar50 + 0.14249323) * fVar50 + -0.16668057)
                             * fVar50 + 0.20000714) * fVar50 + -0.24999994) * fVar50 + 0.3333333) *
                          fVar50 + -0.5) * fVar50 * fVar50) * -2.0;
                    auVar75._8_4_ =
                         (auVar100._8_4_ * 0.6931472 + fVar93 +
                         (((((((((fVar93 * 0.070376836 + -0.1151461) * fVar93 + 0.116769984) *
                                fVar93 + -0.12420141) * fVar93 + 0.14249323) * fVar93 + -0.16668057)
                             * fVar93 + 0.20000714) * fVar93 + -0.24999994) * fVar93 + 0.3333333) *
                          fVar93 + -0.5) * fVar93 * fVar93) * -2.0;
                    auVar75._12_4_ =
                         (auVar100._12_4_ * 0.6931472 + fVar94 +
                         (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 + -0.16668057)
                             * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333) *
                          fVar94 + -0.5) * fVar94 * fVar94) * -2.0;
                    auVar51._8_4_ = 0x7fffffff;
                    auVar51._0_8_ = 0x7fffffff7fffffff;
                    auVar51._12_4_ = 0x7fffffff;
                    auVar99 = vblendvps_avx(auVar75,auVar51,auVar99);
                    auVar99 = vminps_avx(auVar132,auVar99);
                    auVar95 = vmaxps_avx(auVar135,auVar99);
                    auVar137 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar101._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
                    auVar101._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
                    auVar101._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
                    auVar101._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
                    auVar118._0_4_ = (int)auVar101._0_4_;
                    auVar118._4_4_ = (int)auVar101._4_4_;
                    auVar118._8_4_ = (int)auVar101._8_4_;
                    auVar118._12_4_ = (int)auVar101._12_4_;
                    auVar100 = vcvtdq2ps_avx(auVar118);
                    auVar99 = vcmpps_avx(auVar101,auVar100,1);
                    auVar99 = vandps_avx(auVar49,auVar99);
                    auVar99 = vsubps_avx(auVar100,auVar99);
                    auVar119._0_4_ = auVar99._0_4_ * 0.6931472;
                    auVar119._4_4_ = auVar99._4_4_ * 0.6931472;
                    auVar119._8_4_ = auVar99._8_4_ * 0.6931472;
                    auVar119._12_4_ = auVar99._12_4_ * 0.6931472;
                    auVar100 = vsubps_avx(auVar95,auVar119);
                    fVar39 = auVar100._0_4_;
                    fVar50 = auVar100._4_4_;
                    fVar93 = auVar100._8_4_;
                    fVar94 = auVar100._12_4_;
                    auVar55 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                    auVar102._0_4_ = (int)auVar99._0_4_;
                    auVar102._4_4_ = (int)auVar99._4_4_;
                    auVar102._8_4_ = (int)auVar99._8_4_;
                    auVar102._12_4_ = (int)auVar99._12_4_;
                    auVar99 = vpslld_avx(auVar102,0x17);
                    auVar99 = vpaddd_avx(auVar49,auVar99);
                    auVar76._0_4_ =
                         (fVar39 + 1.0 +
                         (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                            fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                         fVar39 * fVar39) * auVar99._0_4_ + 1.0;
                    auVar76._4_4_ =
                         (fVar50 + 1.0 +
                         (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) *
                            fVar50 + 0.041665796) * fVar50 + 0.16666666) * fVar50 + 0.5) *
                         fVar50 * fVar50) * auVar99._4_4_ + 1.0;
                    auVar76._8_4_ =
                         (fVar93 + 1.0 +
                         (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) *
                            fVar93 + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) *
                         fVar93 * fVar93) * auVar99._8_4_ + 1.0;
                    auVar76._12_4_ =
                         (fVar94 + 1.0 +
                         (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                            fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                         fVar94 * fVar94) * auVar99._12_4_ + 1.0;
                    auVar99 = vrcpps_avx(auVar76);
                    fVar39 = auVar99._0_4_;
                    fVar50 = auVar99._4_4_;
                    fVar93 = auVar99._8_4_;
                    fVar94 = auVar99._12_4_;
                    auVar77._0_4_ = auVar76._0_4_ * (fVar39 + fVar39);
                    auVar77._4_4_ = auVar76._4_4_ * (fVar50 + fVar50);
                    auVar77._8_4_ = auVar76._8_4_ * (fVar93 + fVar93);
                    auVar77._12_4_ = auVar76._12_4_ * (fVar94 + fVar94);
                    auVar129._8_4_ = 0x40000000;
                    auVar129._0_8_ = 0x4000000040000000;
                    auVar129._12_4_ = 0x40000000;
                    auVar100 = vsubps_avx(auVar129,auVar77);
                    auVar99._0_4_ = fVar39 + fVar39 + -1.0 + fVar39 * auVar100._0_4_;
                    auVar99._4_4_ = fVar50 + fVar50 + -1.0 + fVar50 * auVar100._4_4_;
                    auVar99._8_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar100._8_4_;
                    auVar99._12_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar100._12_4_;
                    goto LAB_0028acac;
                  case 5:
                    fVar39 = **(float **)(&this->field_0x118 + (long)p_Var33);
                    fVar50 = (*(float **)(&this->field_0x118 + (long)p_Var33))[1];
                    auVar82._0_4_ = fVar39 * fVar56 + fVar50;
                    auVar82._4_4_ = fVar39 * fVar64 + fVar50;
                    auVar82._8_4_ = fVar39 * fVar65 + fVar50;
                    auVar82._12_4_ = fVar39 * fVar66 + fVar50;
                    auVar99 = vmaxps_avx(auVar82,(undefined1  [16])0x0);
                    auVar99 = vminps_avx(auVar49,auVar99);
LAB_0028acac:
                    auVar57._0_4_ = auVar99._0_4_ * fVar56;
                    auVar57._4_4_ = auVar99._4_4_ * fVar64;
                    auVar57._8_4_ = auVar99._8_4_ * fVar65;
                    auVar57._12_4_ = auVar99._12_4_ * fVar66;
                  }
                  fVar39 = auVar55._0_4_;
                  fVar50 = auVar55._4_4_;
                  fVar93 = auVar55._8_4_;
                  fVar94 = auVar55._12_4_;
                  fVar56 = auVar67._0_4_;
                  fVar64 = auVar67._4_4_;
                  fVar65 = auVar67._8_4_;
                  fVar66 = auVar67._12_4_;
                  switch(iVar38) {
                  case 0:
                    auVar67 = vmaxps_avx(auVar67,(undefined1  [16])0x0);
                    break;
                  case 1:
                    auVar99 = vmaxps_avx(auVar67,(undefined1  [16])0x0);
                    auVar100 = vminps_avx(auVar67,(undefined1  [16])0x0);
                    fVar39 = **(float **)(&this->field_0x118 + (long)p_Var33);
                    auVar67._0_4_ = fVar39 * auVar100._0_4_ + auVar99._0_4_;
                    auVar67._4_4_ = fVar39 * auVar100._4_4_ + auVar99._4_4_;
                    auVar67._8_4_ = fVar39 * auVar100._8_4_ + auVar99._8_4_;
                    auVar67._12_4_ = fVar39 * auVar100._12_4_ + auVar99._12_4_;
                    break;
                  case 2:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var33);
                    auVar88._4_4_ = uVar2;
                    auVar88._0_4_ = uVar2;
                    auVar88._8_4_ = uVar2;
                    auVar88._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var33))[1];
                    auVar109._4_4_ = uVar2;
                    auVar109._0_4_ = uVar2;
                    auVar109._8_4_ = uVar2;
                    auVar109._12_4_ = uVar2;
                    auVar99 = vmaxps_avx(auVar67,auVar88);
                    auVar67 = vminps_avx(auVar99,auVar109);
                    break;
                  case 3:
                    auVar68._0_4_ = auVar137._0_4_ ^ (uint)fVar56;
                    auVar68._4_4_ = auVar137._4_4_ ^ (uint)fVar64;
                    auVar68._8_4_ = auVar137._8_4_ ^ (uint)fVar65;
                    auVar68._12_4_ = auVar137._12_4_ ^ (uint)fVar66;
                    auVar99 = vminps_avx(auVar134._0_16_,auVar68);
                    auVar89._8_4_ = 0xc2b0c0a5;
                    auVar89._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar89._12_4_ = 0xc2b0c0a5;
                    auVar95 = vmaxps_avx(auVar99,auVar89);
                    auVar90._0_4_ = auVar95._0_4_ * 1.442695 + fVar39;
                    auVar90._4_4_ = auVar95._4_4_ * 1.442695 + fVar50;
                    auVar90._8_4_ = auVar95._8_4_ * 1.442695 + fVar93;
                    auVar90._12_4_ = auVar95._12_4_ * 1.442695 + fVar94;
                    auVar110._0_4_ = (int)auVar90._0_4_;
                    auVar110._4_4_ = (int)auVar90._4_4_;
                    auVar110._8_4_ = (int)auVar90._8_4_;
                    auVar110._12_4_ = (int)auVar90._12_4_;
                    auVar100 = vcvtdq2ps_avx(auVar110);
                    auVar99 = vcmpps_avx(auVar90,auVar100,1);
                    auVar99 = vandps_avx(auVar49,auVar99);
                    auVar99 = vsubps_avx(auVar100,auVar99);
                    fVar56 = auVar95._0_4_ + auVar99._0_4_ * -0.6931472;
                    fVar64 = auVar95._4_4_ + auVar99._4_4_ * -0.6931472;
                    fVar65 = auVar95._8_4_ + auVar99._8_4_ * -0.6931472;
                    fVar66 = auVar95._12_4_ + auVar99._12_4_ * -0.6931472;
                    auVar91._0_4_ = (int)auVar99._0_4_;
                    auVar91._4_4_ = (int)auVar99._4_4_;
                    auVar91._8_4_ = (int)auVar99._8_4_;
                    auVar91._12_4_ = (int)auVar99._12_4_;
                    auVar99 = vpslld_avx(auVar91,0x17);
                    auVar99 = vpaddd_avx(auVar49,auVar99);
                    auVar69._0_4_ =
                         (fVar56 + 1.0 +
                         fVar56 * fVar56 *
                         (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) *
                            fVar56 + 0.041665796) * fVar56 + 0.16666666) * fVar56 + fVar39)) *
                         auVar99._0_4_ + 1.0;
                    auVar69._4_4_ =
                         (fVar64 + 1.0 +
                         fVar64 * fVar64 *
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + fVar50)) *
                         auVar99._4_4_ + 1.0;
                    auVar69._8_4_ =
                         (fVar65 + 1.0 +
                         fVar65 * fVar65 *
                         (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) *
                            fVar65 + 0.041665796) * fVar65 + 0.16666666) * fVar65 + fVar93)) *
                         auVar99._8_4_ + 1.0;
                    auVar69._12_4_ =
                         (fVar66 + 1.0 +
                         fVar66 * fVar66 *
                         (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) *
                            fVar66 + 0.041665796) * fVar66 + 0.16666666) * fVar66 + fVar94)) *
                         auVar99._12_4_ + 1.0;
                    auVar99 = vrcpps_avx(auVar69);
                    fVar39 = auVar99._0_4_;
                    auVar70._0_4_ = auVar69._0_4_ * fVar39;
                    fVar50 = auVar99._4_4_;
                    auVar70._4_4_ = auVar69._4_4_ * fVar50;
                    fVar93 = auVar99._8_4_;
                    auVar70._8_4_ = auVar69._8_4_ * fVar93;
                    fVar94 = auVar99._12_4_;
                    auVar70._12_4_ = auVar69._12_4_ * fVar94;
                    auVar99 = vsubps_avx(auVar49,auVar70);
                    auVar67._0_4_ = fVar39 + fVar39 * auVar99._0_4_;
                    auVar67._4_4_ = fVar50 + fVar50 * auVar99._4_4_;
                    auVar67._8_4_ = fVar93 + fVar93 * auVar99._8_4_;
                    auVar67._12_4_ = fVar94 + fVar94 * auVar99._12_4_;
                    break;
                  case 4:
                    auVar99 = vminps_avx(auVar134._0_16_,auVar67);
                    auVar136._8_4_ = 0xc2b0c0a5;
                    auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar136._12_4_ = 0xc2b0c0a5;
                    auVar95 = vmaxps_avx(auVar136,auVar99);
                    auVar105._0_4_ = auVar95._0_4_ * 1.442695 + fVar39;
                    auVar105._4_4_ = auVar95._4_4_ * 1.442695 + fVar50;
                    auVar105._8_4_ = auVar95._8_4_ * 1.442695 + fVar93;
                    auVar105._12_4_ = auVar95._12_4_ * 1.442695 + fVar94;
                    auVar120._0_4_ = (int)auVar105._0_4_;
                    auVar120._4_4_ = (int)auVar105._4_4_;
                    auVar120._8_4_ = (int)auVar105._8_4_;
                    auVar120._12_4_ = (int)auVar105._12_4_;
                    auVar100 = vcvtdq2ps_avx(auVar120);
                    auVar99 = vcmpps_avx(auVar105,auVar100,1);
                    auVar99 = vandps_avx(auVar49,auVar99);
                    auVar99 = vsubps_avx(auVar100,auVar99);
                    auVar121._0_4_ = auVar99._0_4_ * 0.6931472;
                    auVar121._4_4_ = auVar99._4_4_ * 0.6931472;
                    auVar121._8_4_ = auVar99._8_4_ * 0.6931472;
                    auVar121._12_4_ = auVar99._12_4_ * 0.6931472;
                    auVar100 = vsubps_avx(auVar95,auVar121);
                    fVar39 = auVar100._0_4_;
                    fVar50 = auVar100._4_4_;
                    fVar93 = auVar100._8_4_;
                    fVar94 = auVar100._12_4_;
                    auVar106._0_4_ = (int)auVar99._0_4_;
                    auVar106._4_4_ = (int)auVar99._4_4_;
                    auVar106._8_4_ = (int)auVar99._8_4_;
                    auVar106._12_4_ = (int)auVar99._12_4_;
                    auVar99 = vpslld_avx(auVar106,0x17);
                    auVar99 = vpaddd_avx(auVar49,auVar99);
                    auVar130._0_4_ =
                         (fVar39 + 1.0 +
                         (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                            fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                         fVar39 * fVar39) * auVar99._0_4_ + 1.0;
                    auVar130._4_4_ =
                         (fVar50 + 1.0 +
                         (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) *
                            fVar50 + 0.041665796) * fVar50 + 0.16666666) * fVar50 + 0.5) *
                         fVar50 * fVar50) * auVar99._4_4_ + 1.0;
                    auVar130._8_4_ =
                         (fVar93 + 1.0 +
                         (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) *
                            fVar93 + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) *
                         fVar93 * fVar93) * auVar99._8_4_ + 1.0;
                    auVar130._12_4_ =
                         (fVar94 + 1.0 +
                         (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                            fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                         fVar94 * fVar94) * auVar99._12_4_ + 1.0;
                    auVar83._8_4_ = 0x800000;
                    auVar83._0_8_ = 0x80000000800000;
                    auVar83._12_4_ = 0x800000;
                    auVar99 = vmaxps_avx(auVar130,auVar83);
                    auVar100 = vpsrld_avx(auVar99,0x17);
                    auVar122._8_4_ = 0x807fffff;
                    auVar122._0_8_ = 0x807fffff807fffff;
                    auVar122._12_4_ = 0x807fffff;
                    auVar99 = vandps_avx(auVar99,auVar122);
                    auVar123._8_4_ = 0x3f000000;
                    auVar123._0_8_ = 0x3f0000003f000000;
                    auVar123._12_4_ = 0x3f000000;
                    auVar67 = vorps_avx(auVar99,auVar123);
                    auVar124._8_4_ = 0xffffff82;
                    auVar124._0_8_ = 0xffffff82ffffff82;
                    auVar124._12_4_ = 0xffffff82;
                    auVar99 = vpaddd_avx(auVar100,auVar124);
                    auVar95 = vcvtdq2ps_avx(auVar99);
                    auVar125._8_4_ = 0x3f3504f3;
                    auVar125._0_8_ = 0x3f3504f33f3504f3;
                    auVar125._12_4_ = 0x3f3504f3;
                    auVar100 = vcmpps_avx(auVar67,auVar125,1);
                    auVar99 = vandps_avx(auVar100,auVar67);
                    fVar39 = auVar99._0_4_ + auVar67._0_4_ + -1.0;
                    fVar50 = auVar99._4_4_ + auVar67._4_4_ + -1.0;
                    fVar93 = auVar99._8_4_ + auVar67._8_4_ + -1.0;
                    fVar94 = auVar99._12_4_ + auVar67._12_4_ + -1.0;
                    auVar99 = vandps_avx(auVar49,auVar100);
                    auVar100 = vsubps_avx(auVar95,auVar99);
                    auVar133._8_4_ = 0x42b0c0a5;
                    auVar133._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar133._12_4_ = 0x42b0c0a5;
                    auVar134 = ZEXT1664(auVar133);
                    auVar99 = vcmpps_avx(auVar130,(undefined1  [16])0x0,2);
                    auVar84._0_4_ =
                         (auVar100._0_4_ * 0.6931472 + fVar39 +
                         (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) *
                                fVar39 + -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057)
                             * fVar39 + 0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) *
                          fVar39 + -0.5) * fVar39 * fVar39) * -2.0;
                    auVar84._4_4_ =
                         (auVar100._4_4_ * 0.6931472 + fVar50 +
                         (((((((((fVar50 * 0.070376836 + -0.1151461) * fVar50 + 0.116769984) *
                                fVar50 + -0.12420141) * fVar50 + 0.14249323) * fVar50 + -0.16668057)
                             * fVar50 + 0.20000714) * fVar50 + -0.24999994) * fVar50 + 0.3333333) *
                          fVar50 + -0.5) * fVar50 * fVar50) * -2.0;
                    auVar84._8_4_ =
                         (auVar100._8_4_ * 0.6931472 + fVar93 +
                         (((((((((fVar93 * 0.070376836 + -0.1151461) * fVar93 + 0.116769984) *
                                fVar93 + -0.12420141) * fVar93 + 0.14249323) * fVar93 + -0.16668057)
                             * fVar93 + 0.20000714) * fVar93 + -0.24999994) * fVar93 + 0.3333333) *
                          fVar93 + -0.5) * fVar93 * fVar93) * -2.0;
                    auVar84._12_4_ =
                         (auVar100._12_4_ * 0.6931472 + fVar94 +
                         (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 + -0.16668057)
                             * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333) *
                          fVar94 + -0.5) * fVar94 * fVar94) * -2.0;
                    auVar52._8_4_ = 0x7fffffff;
                    auVar52._0_8_ = 0x7fffffff7fffffff;
                    auVar52._12_4_ = 0x7fffffff;
                    auVar99 = vblendvps_avx(auVar84,auVar52,auVar99);
                    auVar99 = vminps_avx(auVar133,auVar99);
                    auVar95 = vmaxps_avx(auVar136,auVar99);
                    auVar137 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar107._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
                    auVar107._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
                    auVar107._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
                    auVar107._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
                    auVar126._0_4_ = (int)auVar107._0_4_;
                    auVar126._4_4_ = (int)auVar107._4_4_;
                    auVar126._8_4_ = (int)auVar107._8_4_;
                    auVar126._12_4_ = (int)auVar107._12_4_;
                    auVar100 = vcvtdq2ps_avx(auVar126);
                    auVar99 = vcmpps_avx(auVar107,auVar100,1);
                    auVar99 = vandps_avx(auVar49,auVar99);
                    auVar99 = vsubps_avx(auVar100,auVar99);
                    auVar127._0_4_ = auVar99._0_4_ * 0.6931472;
                    auVar127._4_4_ = auVar99._4_4_ * 0.6931472;
                    auVar127._8_4_ = auVar99._8_4_ * 0.6931472;
                    auVar127._12_4_ = auVar99._12_4_ * 0.6931472;
                    auVar100 = vsubps_avx(auVar95,auVar127);
                    fVar39 = auVar100._0_4_;
                    fVar50 = auVar100._4_4_;
                    fVar93 = auVar100._8_4_;
                    fVar94 = auVar100._12_4_;
                    auVar55 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                    auVar108._0_4_ = (int)auVar99._0_4_;
                    auVar108._4_4_ = (int)auVar99._4_4_;
                    auVar108._8_4_ = (int)auVar99._8_4_;
                    auVar108._12_4_ = (int)auVar99._12_4_;
                    auVar99 = vpslld_avx(auVar108,0x17);
                    auVar99 = vpaddd_avx(auVar49,auVar99);
                    auVar85._0_4_ =
                         (fVar39 + 1.0 +
                         (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                            fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                         fVar39 * fVar39) * auVar99._0_4_ + 1.0;
                    auVar85._4_4_ =
                         (fVar50 + 1.0 +
                         (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) *
                            fVar50 + 0.041665796) * fVar50 + 0.16666666) * fVar50 + 0.5) *
                         fVar50 * fVar50) * auVar99._4_4_ + 1.0;
                    auVar85._8_4_ =
                         (fVar93 + 1.0 +
                         (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) *
                            fVar93 + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) *
                         fVar93 * fVar93) * auVar99._8_4_ + 1.0;
                    auVar85._12_4_ =
                         (fVar94 + 1.0 +
                         (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                            fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                         fVar94 * fVar94) * auVar99._12_4_ + 1.0;
                    auVar99 = vrcpps_avx(auVar85);
                    fVar39 = auVar99._0_4_;
                    fVar50 = auVar99._4_4_;
                    fVar93 = auVar99._8_4_;
                    fVar94 = auVar99._12_4_;
                    auVar86._0_4_ = auVar85._0_4_ * (fVar39 + fVar39);
                    auVar86._4_4_ = auVar85._4_4_ * (fVar50 + fVar50);
                    auVar86._8_4_ = auVar85._8_4_ * (fVar93 + fVar93);
                    auVar86._12_4_ = auVar85._12_4_ * (fVar94 + fVar94);
                    auVar131._8_4_ = 0x40000000;
                    auVar131._0_8_ = 0x4000000040000000;
                    auVar131._12_4_ = 0x40000000;
                    auVar99 = vsubps_avx(auVar131,auVar86);
                    auVar87._0_4_ = fVar39 + fVar39 + -1.0 + fVar39 * auVar99._0_4_;
                    auVar87._4_4_ = fVar50 + fVar50 + -1.0 + fVar50 * auVar99._4_4_;
                    auVar87._8_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar99._8_4_;
                    auVar87._12_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar99._12_4_;
                    goto LAB_0028b0fd;
                  case 5:
                    fVar39 = **(float **)(&this->field_0x118 + (long)p_Var33);
                    fVar50 = (*(float **)(&this->field_0x118 + (long)p_Var33))[1];
                    auVar92._0_4_ = fVar39 * fVar56 + fVar50;
                    auVar92._4_4_ = fVar39 * fVar64 + fVar50;
                    auVar92._8_4_ = fVar39 * fVar65 + fVar50;
                    auVar92._12_4_ = fVar39 * fVar66 + fVar50;
                    auVar99 = vmaxps_avx(auVar92,(undefined1  [16])0x0);
                    auVar87 = vminps_avx(auVar49,auVar99);
LAB_0028b0fd:
                    auVar67._0_4_ = auVar87._0_4_ * fVar56;
                    auVar67._4_4_ = auVar87._4_4_ * fVar64;
                    auVar67._8_4_ = auVar87._8_4_ * fVar65;
                    auVar67._12_4_ = auVar87._12_4_ * fVar66;
                  }
                  if (iVar44 < 0x65) {
                    *pauVar45 = auVar57;
                    pauVar45[1] = auVar67;
                    pauVar45 = pauVar45 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var33) +
                                      (long)local_298 * 0x20);
                    auVar61._0_4_ = auVar57._0_4_ * *pfVar1;
                    auVar61._4_4_ = auVar57._4_4_ * pfVar1[1];
                    auVar61._8_4_ = auVar57._8_4_ * pfVar1[2];
                    auVar61._12_4_ = auVar57._12_4_ * pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var33) + 0x10 +
                                      (long)local_298 * 0x20);
                    auVar71._0_4_ = auVar67._0_4_ * *pfVar1;
                    auVar71._4_4_ = auVar67._4_4_ * pfVar1[1];
                    auVar71._8_4_ = auVar67._8_4_ * pfVar1[2];
                    auVar71._12_4_ = auVar67._12_4_ * pfVar1[3];
                    auVar99 = vandps_avx(auVar137._0_16_,auVar61);
                    auVar100 = vandps_avx(auVar137._0_16_,auVar71);
                    auVar99 = vorps_avx(auVar99,auVar55._0_16_);
                    auVar100 = vorps_avx(auVar100,auVar55._0_16_);
                    auVar62._0_4_ = (int)(auVar61._0_4_ + auVar99._0_4_);
                    auVar62._4_4_ = (int)(auVar61._4_4_ + auVar99._4_4_);
                    auVar62._8_4_ = (int)(auVar61._8_4_ + auVar99._8_4_);
                    auVar62._12_4_ = (int)(auVar61._12_4_ + auVar99._12_4_);
                    auVar72._0_4_ = (int)(auVar71._0_4_ + auVar100._0_4_);
                    auVar72._4_4_ = (int)(auVar71._4_4_ + auVar100._4_4_);
                    auVar72._8_4_ = (int)(auVar71._8_4_ + auVar100._8_4_);
                    auVar72._12_4_ = (int)(auVar71._12_4_ + auVar100._12_4_);
                    auVar99 = vpackssdw_avx(auVar62,auVar72);
                    auVar99 = vpminsw_avx(auVar99,_DAT_003190f0);
                    auVar99 = vpmaxsw_avx(auVar99,_DAT_00319100);
                    auVar99 = vpacksswb_avx(auVar99,auVar99);
                    *(long *)*pauVar46 = auVar99._0_8_;
                    pauVar46 = (undefined1 (*) [16])((long)*pauVar46 + 8);
                  }
                  bVar48 = iVar29 != iVar27;
                  iVar29 = iVar29 + 1;
                } while (bVar48);
              }
              uVar47 = (ulong)(iVar37 + 1);
            } while (iVar37 != (int)local_230);
          }
          local_298 = (_func_int **)((long)local_298 + 1);
          local_2b8 = (ulong)(uint)((int)local_2b8 + iVar42);
        } while (local_298 != local_2a0);
      }
      local_2a8 = top_blob;
      if ((pointer)local_318._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
      }
      iVar29 = 0;
      top_blob = local_2a8;
      local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (local_138._0_4_ != 1) goto LAB_0028c38a;
    }
    p_Var33 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
    iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var33);
    if ((long)iVar42 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var33) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var33) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var33) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var33) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var33) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var33) < 2)) {
        if (iVar44 < 0x65) {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_8_ = (Allocator *)0x0;
          p_Var33 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]))
          {
            lVar32 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              local_288._0_4_ =
                   1.0 / (*(float *)(*(long *)(p_Var33 + 0x1f8) + lVar32 * 4) *
                         *(float *)(*(long *)(p_Var33 + 0x240) + lVar32 * 4));
              if (local_318._8_8_ == local_318._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)local_288);
              }
              else {
                *(undefined4 *)local_318._8_8_ = local_288._0_4_;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var33 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
            } while (lVar32 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s1_int8_dequant_sse
                    (&local_228,top_blob,(Mat *)(p_Var33 + 0x168),(Mat *)(p_Var33 + 0x1b0),&local_a8
                     ,opt_00);
        }
        else {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_8_ = (Allocator *)0x0;
          p_Var33 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]))
          {
            lVar32 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              fVar39 = *(float *)(*(long *)(p_Var33 + 0x1f8) + lVar32 * 4);
              local_288._0_4_ = 0.0;
              if (fVar39 != 0.0) {
                local_288._0_4_ =
                     1.0 / (fVar39 * *(float *)(*(long *)(p_Var33 + 0x240) + lVar32 * 4));
              }
              local_1d8._0_4_ = *(float *)(*(long *)(p_Var33 + 0x288) + lVar32 * 4);
              if (local_318._8_8_ == local_318._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)local_288);
              }
              else {
                *(undefined4 *)local_318._8_8_ = local_288._0_4_;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              if (local_318._8_8_ == local_318._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_1d8);
              }
              else {
                *(float *)local_318._8_8_ = (float)local_1d8;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var33 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
            } while (lVar32 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s1_int8_requant_sse
                    (&local_228,top_blob,(Mat *)(p_Var33 + 0x168),(Mat *)(p_Var33 + 0x1b0),&local_90
                     ,opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_318._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
        }
        pLVar5 = this->activation;
      }
      else {
        if ((((iVar42 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var33) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var33) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var33) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var33) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var33) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var33))) goto LAB_0028bd53;
        if (iVar44 < 0x65) {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_8_ = (Allocator *)0x0;
          p_Var33 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]))
          {
            lVar32 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              local_288._0_4_ =
                   1.0 / (*(float *)(*(long *)(p_Var33 + 0x1f8) + lVar32 * 4) *
                         *(float *)(*(long *)(p_Var33 + 0x240) + lVar32 * 4));
              if (local_318._8_8_ == local_318._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)local_288);
              }
              else {
                *(undefined4 *)local_318._8_8_ = local_288._0_4_;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var33 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
            } while (lVar32 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s2_int8_dequant_sse
                    (&local_228,top_blob,(Mat *)(p_Var33 + 0x168),(Mat *)(p_Var33 + 0x1b0),&local_d8
                     ,opt_00);
        }
        else {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_8_ = (Allocator *)0x0;
          p_Var33 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]))
          {
            lVar32 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              fVar39 = *(float *)(*(long *)(p_Var33 + 0x1f8) + lVar32 * 4);
              local_288._0_4_ = 0.0;
              if (fVar39 != 0.0) {
                local_288._0_4_ =
                     1.0 / (fVar39 * *(float *)(*(long *)(p_Var33 + 0x240) + lVar32 * 4));
              }
              local_1d8._0_4_ = *(float *)(*(long *)(p_Var33 + 0x288) + lVar32 * 4);
              if (local_318._8_8_ == local_318._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)local_288);
              }
              else {
                *(undefined4 *)local_318._8_8_ = local_288._0_4_;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              if (local_318._8_8_ == local_318._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_1d8);
              }
              else {
                *(float *)local_318._8_8_ = (float)local_1d8;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var33 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
            } while (lVar32 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s2_int8_requant_sse
                    (&local_228,top_blob,(Mat *)(p_Var33 + 0x168),(Mat *)(p_Var33 + 0x1b0),&local_c0
                     ,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_318._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
        }
        pLVar5 = this->activation;
      }
      if (pLVar5 != (Layer *)0x0) {
        (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
        iVar29 = 0;
        goto LAB_0028c38a;
      }
    }
    else {
LAB_0028bd53:
      local_2b8 = (long)*(int *)(&this->field_0xd8 + (long)p_Var33) * (long)iVar42;
      local_2a8 = top_blob;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_318,local_2b8,
                 (allocator_type *)local_288);
      uVar14 = local_318._0_8_;
      pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var33 = pp_Var41[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var33)) {
        iVar42 = *(int *)(&this->field_0xe0 + (long)p_Var33);
        iVar37 = *(int *)(&this->field_0xdc + (long)p_Var33);
        iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var33);
        iVar38 = 0;
        fVar39 = 0.0;
        iVar40 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var41[-3])) {
            lVar32 = 0;
            do {
              *(float *)(local_318._0_8_ + (iVar40 + lVar32) * 4) = fVar39;
              fVar39 = (float)((int)fVar39 + *(int *)(&this->field_0xdc + (long)pp_Var41[-3]));
              lVar32 = lVar32 + 1;
            } while ((int)lVar32 < *(int *)(&this->field_0xd4 + (long)pp_Var41[-3]));
            iVar40 = iVar40 + (int)lVar32;
          }
          fVar39 = (float)((int)fVar39 + ((int)local_238 * iVar42 - iVar37 * iVar29));
          iVar38 = iVar38 + 1;
        } while (iVar38 < *(int *)(&this->field_0xd8 + (long)pp_Var41[-3]));
      }
      if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])) {
        local_238 = (long)(int)local_2b8;
        pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx;
        uVar47 = local_2b8 & 0xffffffff;
        local_290 = 0;
        auVar55 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        lVar32 = 0;
        uVar34 = local_2b8;
        local_298 = pp_Var41;
        do {
          pvVar4 = local_228.data;
          if (-1 < (int)local_230) {
            lVar43 = local_228.cstep * lVar32 * local_228.elemsize;
            local_2c8 = (float *)(local_2a8->cstep * lVar32 * local_2a8->elemsize +
                                 (long)local_2a8->data);
            local_2b0 = (long)local_228.w * local_228.elemsize;
            lVar35 = *(long *)(&this->field_0x168 + (long)pp_Var41[-3]) + local_290;
            local_2a0 = (_func_int **)0x0;
            local_2c0 = local_2c8;
            do {
              if (-1 < iVar27) {
                lVar28 = (long)(int)local_2a0;
                iVar42 = 0;
                do {
                  p_Var33 = pp_Var41[-3];
                  fVar39 = 0.0;
                  fVar50 = 0.0;
                  if (0 < (int)uVar34) {
                    uVar31 = 0;
                    iVar37 = 0;
                    do {
                      iVar37 = iVar37 + (int)*(char *)(lVar35 + uVar31) *
                                        (int)*(char *)((long)pvVar4 +
                                                      (long)(int)*(pointer)(uVar14 + uVar31 * 4) +
                                                      *(int *)(&this->field_0xe8 + (long)p_Var33) *
                                                      lVar28 * local_2b0 +
                                                      (long)iVar42 *
                                                      (long)*(int *)(&this->field_0xe4 +
                                                                    (long)p_Var33) + lVar43);
                      uVar31 = uVar31 + 1;
                    } while (uVar47 != uVar31);
                    fVar50 = (float)iVar37;
                  }
                  fVar93 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var33) + lVar32 * 4);
                  if (fVar93 != 0.0) {
                    fVar39 = 1.0 / (fVar93 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var33
                                                                 ) + lVar32 * 4));
                  }
                  fVar39 = fVar39 * fVar50;
                  if (*(int *)(&this->field_0x100 + (long)p_Var33) != 0) {
                    fVar39 = fVar39 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var33) +
                                                lVar32 * 4);
                  }
                  auVar49 = ZEXT416((uint)fVar39);
                  fVar50 = fVar39;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var33)) {
                  case 1:
                    auVar49 = vmaxss_avx(auVar49,ZEXT416(0));
                    fVar50 = auVar49._0_4_;
                    break;
                  case 2:
                    auVar49 = vcmpss_avx(ZEXT816(0) << 0x40,auVar49,1);
                    auVar53._8_4_ = 0x3f800000;
                    auVar53._0_8_ = 0x3f8000003f800000;
                    auVar53._12_4_ = 0x3f800000;
                    auVar49 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var33))
                                            ,auVar53,auVar49);
                    fVar94 = auVar49._0_4_;
LAB_0028c0cc:
                    fVar50 = fVar94 * fVar39;
                    break;
                  case 3:
                    auVar49 = vmaxss_avx(auVar49,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var33)));
                    auVar49 = vminss_avx(auVar49,ZEXT416((*(uint **)(&this->field_0x118 +
                                                                    (long)p_Var33))[1]));
                    fVar50 = auVar49._0_4_;
                    break;
                  case 4:
                    fVar39 = expf((float)((uint)fVar39 ^ auVar55._0_4_));
                    auVar55 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    uVar34 = local_2b8;
                    pp_Var41 = local_298;
                    fVar50 = 1.0 / (fVar39 + 1.0);
                    break;
                  case 5:
                    local_138 = auVar49;
                    fVar39 = expf(fVar39);
                    fVar39 = logf(fVar39 + 1.0);
                    fVar39 = tanhf(fVar39);
                    auVar55 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    uVar34 = local_2b8;
                    pp_Var41 = local_298;
                    fVar50 = fVar39 * (float)local_138._0_4_;
                    break;
                  case 6:
                    fVar93 = **(float **)(&this->field_0x118 + (long)p_Var33);
                    fVar94 = (*(float **)(&this->field_0x118 + (long)p_Var33))[1];
                    fVar56 = (float)((uint)fVar94 ^ auVar55._0_4_) / fVar93;
                    fVar50 = 0.0;
                    if ((fVar56 <= fVar39) && (fVar50 = fVar39, fVar39 <= fVar56 + 1.0 / fVar93)) {
                      fVar94 = fVar93 * fVar39 + fVar94;
                      goto LAB_0028c0cc;
                    }
                  }
                  if (iVar44 < 0x65) {
                    *local_2c0 = fVar50;
                    local_2c0 = local_2c0 + 1;
                  }
                  else {
                    fVar50 = fVar50 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var33) +
                                                lVar32 * 4);
                    auVar49 = vandps_avx(ZEXT416((uint)fVar50),auVar55._0_16_);
                    auVar54._8_4_ = 0x3effffff;
                    auVar54._0_8_ = 0x3effffff3effffff;
                    auVar54._12_4_ = 0x3effffff;
                    auVar49 = vorps_avx(auVar49,auVar54);
                    auVar49 = ZEXT416((uint)(fVar50 + auVar49._0_4_));
                    auVar49 = vroundss_avx(auVar49,auVar49,0xb);
                    iVar37 = (int)auVar49._0_4_;
                    if (iVar37 < -0x7e) {
                      iVar37 = -0x7f;
                    }
                    uVar24 = (undefined1)iVar37;
                    if (0x7e < iVar37) {
                      uVar24 = 0x7f;
                    }
                    *(undefined1 *)local_2c8 = uVar24;
                    local_2c8 = (float *)((long)local_2c8 + 1);
                  }
                  bVar48 = iVar42 != iVar27;
                  iVar42 = iVar42 + 1;
                } while (bVar48);
              }
              iVar42 = (int)local_2a0;
              local_2a0 = (_func_int **)(ulong)(iVar42 + 1);
            } while (iVar42 != (int)local_230);
          }
          lVar32 = lVar32 + 1;
          local_290 = local_290 + local_238;
        } while (lVar32 < *(int *)(&this->field_0x108 + (long)pp_Var41[-3]));
      }
      if ((pointer)local_318._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
      }
    }
    iVar29 = 0;
    goto LAB_0028c38a;
  }
  local_2b0 = 1;
  if (opt->use_packing_layout == true) {
    local_2b0 = (ulong)((uint)(((&this->field_0xd0)[(long)p_Var33] & 3) == 0) * 3 + 1);
  }
  iVar27 = (int)local_2b0;
  uVar34 = (ulong)(uint)(iVar27 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var33)) {
    uVar34 = local_2b0;
  }
  Mat::create(top_blob,iVar37,iVar42,*(int *)(&this->field_0xd0 + (long)p_Var33) / iVar27,uVar34,
              iVar27,opt->blob_allocator);
  auVar23 = local_2f8;
  iVar29 = -100;
  local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
  if ((top_blob->data == (void *)0x0) ||
     (local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0028c38a;
  uVar36 = (int)uVar36 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  local_2c0 = (float *)CONCAT44(local_2c0._4_4_,uVar36);
  uVar25 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  local_2c8 = (float *)CONCAT44(local_2c8._4_4_,uVar25);
  local_33c = 1;
  uVar26 = 1;
  if (opt->use_packing_layout == true) {
    local_33c = 1;
    if ((uVar36 & 7) == 0) {
      local_33c = 8;
    }
    uVar26 = (uint)((uVar25 & 3) == 0) * 3 + 1;
  }
  piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_318._0_8_ = local_228.data;
  local_318._8_4_ = local_228.refcount._0_4_;
  local_318._12_4_ = local_228.refcount._4_4_;
  local_318._16_8_ = local_228.elemsize;
  local_318._24_4_ = local_228.elempack;
  local_2f8._12_4_ = local_228.w;
  local_2f8._8_4_ = local_228.dims;
  local_2f8._20_4_ = local_228.d;
  local_2f8._16_4_ = local_228.h;
  local_2f8._0_8_ = local_228.allocator;
  local_2f8._28_4_ = auVar23._28_4_;
  local_2f8._24_4_ = local_228.c;
  local_2d8 = local_228.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (local_33c < (int)local_138._0_4_) {
    uVar14._0_1_ = opt->lightmode;
    uVar14._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar14._4_4_ = opt->num_threads;
    local_288._16_8_ = opt->workspace_allocator;
    uVar15 = opt->openmp_blocktime;
    uVar16 = opt->use_winograd_convolution;
    uVar18 = opt->use_sgemm_convolution;
    uVar20 = opt->use_int8_inference;
    uVar22 = opt->use_vulkan_compute;
    uVar21 = CONCAT11(uVar22,uVar20);
    uVar19 = CONCAT21(uVar21,uVar18);
    uVar17 = CONCAT31(uVar19,uVar16);
    local_288._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    auStack_260[0] = opt->use_shader_pack8;
    auStack_260[1] = opt->use_subgroup_basic;
    auStack_260[2] = opt->use_subgroup_vote;
    auStack_260[3] = opt->use_subgroup_ballot;
    auStack_260[4] = opt->use_subgroup_shuffle;
    auStack_260[5] = opt->use_image_storage;
    auStack_260[6] = opt->use_tensor_storage;
    auStack_260[7] = opt->use_weight_fp16_storage;
    auStack_260._8_4_ = opt->flush_denormals;
    auStack_260[0xc] = opt->use_local_pool_allocator;
    auStack_260[0xd] = opt->use_reserved_1;
    auStack_260[0xe] = opt->use_reserved_2;
    auStack_260[0xf] = opt->use_reserved_3;
    uStack_250._0_1_ = opt->use_reserved_4;
    uStack_250._1_1_ = opt->use_reserved_5;
    uStack_250._2_1_ = opt->use_reserved_6;
    uStack_250._3_1_ = opt->use_reserved_7;
    uStack_250._4_1_ = opt->use_reserved_8;
    uStack_250._5_1_ = opt->use_reserved_9;
    uStack_250._6_1_ = opt->use_reserved_10;
    uStack_250._7_1_ = opt->use_reserved_11;
    local_288._0_4_ = (undefined4)uVar14;
    local_288._8_4_ = SUB84(opt->workspace_allocator,0);
    local_288._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_288._4_4_ = uVar14._4_4_;
    local_288._24_4_ = uVar15;
    local_288._28_4_ = uVar17;
    convert_packing(&local_228,(Mat *)local_318,local_33c,(Option *)local_288);
  }
  piVar3 = top_blob->refcount;
  local_288._0_4_ = SUB84(top_blob->data,0);
  local_288._4_4_ = (undefined4)((ulong)top_blob->data >> 0x20);
  local_288._8_4_ = SUB84(top_blob->refcount,0);
  local_288._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
  local_288._16_8_ = top_blob->elemsize;
  local_288._24_4_ = top_blob->elempack;
  local_288._32_8_ = top_blob->allocator;
  auStack_260._0_4_ = top_blob->dims;
  auStack_260._4_4_ = top_blob->w;
  auStack_260._8_4_ = top_blob->h;
  auStack_260._12_4_ = top_blob->d;
  uStack_250 = CONCAT44(uStack_250._4_4_,top_blob->c);
  local_248 = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (uVar26 < (uint)local_2b0) {
    Mat::create((Mat *)local_288,iVar37,iVar42,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
                (int)uVar26,(ulong)((int)(uVar34 / (local_2b0 & 0xffffffff)) * uVar26),uVar26,
                opt->workspace_allocator);
    iVar29 = -100;
    if ((CONCAT44(local_288._4_4_,local_288._0_4_) != 0) && ((long)(int)uStack_250 * local_248 != 0)
       ) goto LAB_0028b6a0;
  }
  else {
LAB_0028b6a0:
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])) {
      iVar27 = (int)local_2c0 / local_33c;
      iVar37 = (int)local_2c8 / (int)uVar26;
      iVar44 = 0;
      iVar42 = 0;
      lVar32 = 0;
      do {
        if (local_2f8._8_4_ == 3) {
          local_1b0._4_4_ = local_2f8._12_4_;
          local_1b0._0_4_ = 3;
          local_1b0._8_4_ = local_2f8._16_4_;
          local_1b0._12_4_ = 1;
          lVar35 = (long)(int)local_2f8._16_4_ * (long)(int)local_2f8._12_4_ * local_318._16_8_;
        }
        else {
          local_1b0._4_4_ = local_2f8._12_4_;
          local_1b0._0_4_ = 4;
          local_1b0._8_4_ = local_2f8._16_4_;
          local_1b0._12_4_ = local_2f8._20_4_;
          lVar35 = (long)(int)local_2f8._16_4_ * (long)(int)local_2f8._12_4_ *
                   (long)(int)local_2f8._20_4_ * local_318._16_8_;
        }
        local_1d8 = (pointer)((long)(iVar44 / local_33c) * local_2d8 * local_318._16_8_ +
                             local_318._0_8_);
        local_1b8 = (Allocator *)local_2f8._0_8_;
        local_1c0 = local_318._24_4_;
        uStack_1cc = 0;
        uStack_1d0 = 0;
        local_1c8 = (Allocator *)local_318._16_8_;
        local_198 = (lVar35 + 0xfU & 0xfffffffffffffff0) / (ulong)local_318._16_8_;
        if (auStack_260._0_4_ == 3) {
          local_188 = (void *)((long)(iVar42 / (int)uVar26) * local_248 * local_288._16_8_ +
                              CONCAT44(local_288._4_4_,local_288._0_4_));
          local_160._4_4_ = auStack_260._4_4_;
          local_160._0_4_ = 3;
          local_160._8_4_ = auStack_260._8_4_;
          local_160._12_4_ = 1;
          lVar35 = (long)(int)auStack_260._8_4_ * (long)(int)auStack_260._4_4_ * local_288._16_8_;
        }
        else {
          local_188 = (void *)((long)(iVar42 / (int)uVar26) * local_248 * local_288._16_8_ +
                              CONCAT44(local_288._4_4_,local_288._0_4_));
          local_160._4_4_ = auStack_260._4_4_;
          local_160._0_4_ = 4;
          local_160._8_4_ = auStack_260._8_4_;
          local_160._12_4_ = auStack_260._12_4_;
          lVar35 = (long)(int)auStack_260._8_4_ * (long)(int)auStack_260._4_4_ *
                   (long)(int)auStack_260._12_4_ * local_288._16_8_;
        }
        local_168 = (Allocator *)local_288._32_8_;
        local_170 = local_288._24_4_;
        uStack_17c = 0;
        uStack_180 = 0;
        local_178 = (Allocator *)local_288._16_8_;
        local_148 = (lVar35 + 0xfU & 0xfffffffffffffff0) / (ulong)local_288._16_8_;
        pLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar32];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_weight_fp16_storage;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_reserved_1;
        uStack_48._6_1_ = opt->use_reserved_2;
        uStack_48._7_1_ = opt->use_reserved_3;
        uStack_40._0_1_ = opt->use_reserved_4;
        uStack_40._1_1_ = opt->use_reserved_5;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = top_blob->allocator;
        local_1a0 = iVar27;
        local_150 = iVar37;
        (*pLVar5->_vptr_Layer[7])(pLVar5,&local_1d8,&local_188,&local_78);
        piVar3 = (int *)CONCAT44(uStack_17c,uStack_180);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_168 == (Allocator *)0x0) {
              if (local_188 != (void *)0x0) {
                free(local_188);
              }
            }
            else {
              (*local_168->_vptr_Allocator[3])();
            }
          }
        }
        local_148 = 0;
        local_188 = (void *)0x0;
        uStack_180 = 0;
        uStack_17c = 0;
        local_178 = (Allocator *)0x0;
        local_170 = 0;
        local_160 = (undefined1  [16])0x0;
        local_150 = 0;
        piVar3 = (int *)CONCAT44(uStack_1cc,uStack_1d0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (local_1d8 != (pointer)0x0) {
                free(local_1d8);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
        local_198 = 0;
        local_1d8._0_4_ = 0.0;
        local_1d8._4_4_ = 0;
        uStack_1d0 = 0;
        uStack_1cc = 0;
        local_1c8 = (Allocator *)0x0;
        local_1c0 = 0;
        local_1b0 = (undefined1  [16])0x0;
        local_1a0 = 0;
        lVar32 = lVar32 + 1;
        iVar42 = iVar42 + (int)local_2c8;
        iVar44 = iVar44 + (int)local_2c0;
      } while (lVar32 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
    }
    if (uVar26 < (uint)local_2b0) {
      convert_packing((Mat *)local_288,top_blob,(uint)local_2b0,opt);
      iVar29 = 0;
    }
    else {
      iVar29 = 0;
      if ((Mat *)local_288 != top_blob) {
        piVar3 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar49 = auStack_260;
        iVar29 = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = (void *)CONCAT44(local_288._4_4_,local_288._0_4_);
        top_blob->refcount = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        top_blob->elemsize = local_288._16_8_;
        top_blob->elempack = local_288._24_4_;
        top_blob->allocator = (Allocator *)local_288._32_8_;
        top_blob->dims = auStack_260._0_4_;
        top_blob->w = auStack_260._4_4_;
        top_blob->h = auStack_260._8_4_;
        top_blob->d = auStack_260._12_4_;
        top_blob->c = (int)uStack_250;
        top_blob->cstep = local_248;
        auStack_260 = auVar49;
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_288._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_288._4_4_,local_288._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_288._4_4_,local_288._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_288._32_8_)[3])();
      }
    }
  }
  local_248 = 0;
  local_288._0_4_ = 0.0;
  local_288._4_4_ = 0;
  local_288._8_4_ = 0;
  local_288._12_4_ = 0;
  local_288._16_8_ = (Allocator *)0x0;
  local_288._24_4_ = 0;
  auStack_260 = (undefined1  [16])0x0;
  uStack_250 = uStack_250 & 0xffffffff00000000;
  piVar3 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_2f8._0_8_ == (Allocator *)0x0) {
        if ((pointer)local_318._0_8_ != (pointer)0x0) {
          free((void *)local_318._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2f8._0_8_)[3])();
      }
    }
  }
  local_2d8 = 0;
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = (Allocator *)0x0;
  local_318._16_8_ = (Allocator *)0x0;
  local_318._24_4_ = 0;
  local_2f8._0_28_ = ZEXT828((ulong)local_2f8._0_8_);
LAB_0028c38a:
  piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if ((pointer)local_228.data != (pointer)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
        if ((void *)local_128._0_8_ != (void *)0x0) {
          free((void *)local_128._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_128._32_8_)[3])();
      }
    }
  }
  return iVar29;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}